

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall TTD::SnapShot::SnapShot(SnapShot *this,double gcTime)

{
  SnapObjectVTable *pSVar1;
  fPtr_DoObjectInflation local_508;
  fPtr_DoAddtlValueInstantiation local_500;
  fPtr_EmitAddtlInfo local_4f8;
  fPtr_ParseAddtlInfo local_4f0;
  code *local_4e8;
  code *local_4e0;
  code *local_4d8;
  code *local_4d0;
  code *local_4c8;
  code *local_4c0;
  code *local_4b8;
  code *local_4b0;
  code *local_4a8;
  code *local_4a0;
  code *local_498;
  code *local_490;
  code *local_488;
  code *local_480;
  code *local_478;
  code *local_470;
  code *local_468;
  code *local_460;
  code *local_458;
  code *local_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  code *local_430;
  code *local_428;
  undefined8 local_420;
  code *local_418;
  code *local_410;
  code *local_408;
  undefined8 local_400;
  code *local_3f8;
  code *local_3f0;
  code *local_3e8;
  undefined8 local_3e0;
  code *local_3d8;
  code *local_3d0;
  code *local_3c8;
  undefined8 local_3c0;
  code *local_3b8;
  code *local_3b0;
  code *local_3a8;
  code *local_3a0;
  code *local_398;
  code *local_390;
  code *local_388;
  code *local_380;
  code *local_378;
  code *local_370;
  code *local_368;
  undefined8 local_360;
  code *local_358;
  code *local_350;
  code *local_348;
  undefined8 local_340;
  code *local_338;
  code *local_330;
  code *local_328;
  code *local_320;
  code *local_318;
  code *local_310;
  code *local_308;
  code *local_300;
  code *local_2f8;
  code *local_2f0;
  code *local_2e8;
  code *local_2e0;
  code *local_2d8;
  code *local_2d0;
  code *local_2c8;
  code *local_2c0;
  code *local_2b8;
  code *local_2b0;
  code *local_2a8;
  fPtr_DoAddtlValueInstantiation local_2a0;
  fPtr_EmitAddtlInfo local_298;
  fPtr_ParseAddtlInfo local_290;
  code *local_288;
  undefined8 local_280;
  code *local_278;
  code *local_270;
  code *local_268;
  undefined8 local_260;
  code *local_258;
  code *local_250;
  code *local_248;
  code *local_240;
  code *local_238;
  code *local_230;
  code *local_228;
  undefined8 local_220;
  code *local_218;
  code *local_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  code *local_1f0;
  code *local_1e8;
  fPtr_DoAddtlValueInstantiation local_1e0;
  fPtr_EmitAddtlInfo local_1d8;
  fPtr_ParseAddtlInfo local_1d0;
  code *local_1c8;
  fPtr_DoAddtlValueInstantiation local_1c0;
  fPtr_EmitAddtlInfo local_1b8;
  fPtr_ParseAddtlInfo local_1b0;
  code *local_1a8;
  fPtr_DoAddtlValueInstantiation local_1a0;
  fPtr_EmitAddtlInfo local_198;
  fPtr_ParseAddtlInfo local_190;
  code *local_188;
  fPtr_DoAddtlValueInstantiation local_180;
  fPtr_EmitAddtlInfo local_178;
  fPtr_ParseAddtlInfo local_170;
  code *local_168;
  undefined8 local_160;
  code *local_158;
  code *local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  code *local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  code *local_110;
  fPtr_DoObjectInflation local_108;
  fPtr_DoAddtlValueInstantiation local_100;
  fPtr_EmitAddtlInfo local_f8;
  fPtr_ParseAddtlInfo local_f0;
  code *local_e8;
  code *local_e0;
  code *local_d8;
  code *local_d0;
  code *local_c8;
  fPtr_DoAddtlValueInstantiation local_c0;
  fPtr_EmitAddtlInfo local_b8;
  fPtr_ParseAddtlInfo local_b0;
  code *local_a8;
  fPtr_DoAddtlValueInstantiation local_a0;
  fPtr_EmitAddtlInfo local_98;
  fPtr_ParseAddtlInfo local_90;
  code *local_88;
  fPtr_DoAddtlValueInstantiation local_80;
  fPtr_EmitAddtlInfo local_78;
  fPtr_ParseAddtlInfo local_70;
  fPtr_DoObjectInflation local_68;
  fPtr_DoAddtlValueInstantiation local_60;
  fPtr_EmitAddtlInfo local_58;
  fPtr_ParseAddtlInfo local_50;
  fPtr_DoObjectInflation local_48;
  fPtr_DoAddtlValueInstantiation local_40;
  fPtr_EmitAddtlInfo local_38;
  fPtr_ParseAddtlInfo local_30;
  double local_18;
  double gcTime_local;
  SnapShot *this_local;
  
  local_18 = gcTime;
  gcTime_local = (double)this;
  SlabAllocatorBase<0>::SlabAllocatorBase(&this->m_slabAllocator,0x200000);
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::UnorderedArrayList
            (&this->m_ctxList,&this->m_slabAllocator);
  UnorderedArrayList<int,_32UL>::UnorderedArrayList
            (&this->m_tcSymbolRegistrationMapContents,&this->m_slabAllocator);
  this->m_activeScriptContext = 0;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::UnorderedArrayList
            (&this->m_rootList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::UnorderedArrayList
            (&this->m_handlerList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapType::SnapType,_2048UL>::UnorderedArrayList
            (&this->m_typeList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::UnorderedArrayList
            (&this->m_functionBodyList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::UnorderedArrayList
            (&this->m_primitiveObjectList,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::UnorderedArrayList
            (&this->m_compoundObjectList,&this->m_slabAllocator);
  this->m_snapObjectVTableArray = (SnapObjectVTable *)0x0;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::UnorderedArrayList
            (&this->m_scopeEntries,&this->m_slabAllocator);
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::UnorderedArrayList
            (&this->m_slotArrayEntries,&this->m_slabAllocator);
  this->GCTime = local_18;
  this->MarkTime = 0.0;
  this->ExtractTime = 0.0;
  pSVar1 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapObjects::SnapObjectVTable>
                     (&this->m_slabAllocator,0x2a);
  this->m_snapObjectVTableArray = pSVar1;
  memset(this->m_snapObjectVTableArray,0,0x540);
  memset(&local_48,0,0x20);
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1->InflationFunc = local_48;
  pSVar1->AddtlInstationationFunc = local_40;
  pSVar1->EmitAddtlInfoFunc = local_38;
  pSVar1->ParseAddtlInfoFunc = local_30;
  memset(&local_68,0,0x20);
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[1].InflationFunc = local_68;
  pSVar1[1].AddtlInstationationFunc = local_60;
  pSVar1[1].EmitAddtlInfoFunc = local_58;
  pSVar1[1].ParseAddtlInfoFunc = local_50;
  memset(&local_88,0,0x20);
  local_88 = NSSnapObjects::DoObjectInflation_SnapDynamicObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[2].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDynamicObject;
  pSVar1[2].AddtlInstationationFunc = local_80;
  pSVar1[2].EmitAddtlInfoFunc = local_78;
  pSVar1[2].ParseAddtlInfoFunc = local_70;
  memset(&local_a8,0,0x20);
  local_a8 = NSSnapObjects::DoObjectInflation_SnapAwaitObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x26].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAwaitObject;
  pSVar1[0x26].AddtlInstationationFunc = local_a0;
  pSVar1[0x26].EmitAddtlInfoFunc = local_98;
  pSVar1[0x26].ParseAddtlInfoFunc = local_90;
  memset(&local_c8,0,0x20);
  local_c8 = NSSnapObjects::DoObjectInflation_SnapExternalObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[3].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalObject;
  pSVar1[3].AddtlInstationationFunc = local_c0;
  pSVar1[3].EmitAddtlInfoFunc = local_b8;
  pSVar1[3].ParseAddtlInfoFunc = local_b0;
  local_e8 = NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo;
  local_e0 = NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo;
  local_d8 = NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo;
  local_d0 = NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[4].InflationFunc = NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo;
  pSVar1[4].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo;
  pSVar1[4].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo;
  pSVar1[4].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo;
  memset(&local_108,0,0x20);
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[5].InflationFunc = local_108;
  pSVar1[5].AddtlInstationationFunc = local_100;
  pSVar1[5].EmitAddtlInfoFunc = local_f8;
  pSVar1[5].ParseAddtlInfoFunc = local_f0;
  local_128 = NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo;
  local_120 = 0;
  local_118 = NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo;
  local_110 = NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[6].InflationFunc = NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo;
  pSVar1[6].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[6].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo;
  pSVar1[6].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo;
  local_148 = NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo;
  local_140 = 0;
  local_138 = NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo;
  local_130 = NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[7].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo;
  pSVar1[7].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[7].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo;
  pSVar1[7].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo;
  local_168 = NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo;
  local_160 = 0;
  local_158 = NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo;
  local_150 = NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[8].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo;
  pSVar1[8].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[8].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo;
  pSVar1[8].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo;
  memset(&local_188,0,0x20);
  local_188 = NSSnapObjects::DoObjectInflation_SnapActivationInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[9].InflationFunc = NSSnapObjects::DoObjectInflation_SnapActivationInfo;
  pSVar1[9].AddtlInstationationFunc = local_180;
  pSVar1[9].EmitAddtlInfoFunc = local_178;
  pSVar1[9].ParseAddtlInfoFunc = local_170;
  memset(&local_1a8,0,0x20);
  local_1a8 = NSSnapObjects::DoObjectInflation_SnapBlockActivationObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBlockActivationObject;
  pSVar1[10].AddtlInstationationFunc = local_1a0;
  pSVar1[10].EmitAddtlInfoFunc = local_198;
  pSVar1[10].ParseAddtlInfoFunc = local_190;
  memset(&local_1c8,0,0x20);
  local_1c8 = NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xb].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject;
  pSVar1[0xb].AddtlInstationationFunc = local_1c0;
  pSVar1[0xb].EmitAddtlInfoFunc = local_1b8;
  pSVar1[0xb].ParseAddtlInfoFunc = local_1b0;
  memset(&local_1e8,0,0x20);
  local_1e8 = NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xc].InflationFunc = NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject;
  pSVar1[0xc].AddtlInstationationFunc = local_1e0;
  pSVar1[0xc].EmitAddtlInfoFunc = local_1d8;
  pSVar1[0xc].ParseAddtlInfoFunc = local_1d0;
  local_208 = NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo;
  local_200 = 0;
  local_1f8 = NSSnapObjects::
              EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  local_1f0 = NSSnapObjects::
              ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xd].InflationFunc = NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo;
  pSVar1[0xd].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xd].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  pSVar1[0xd].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)13>;
  local_228 = NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo;
  local_220 = 0;
  local_218 = NSSnapObjects::
              EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  local_210 = NSSnapObjects::
              ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xe].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo;
  pSVar1[0xe].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0xe].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  pSVar1[0xe].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<(TTD::NSSnapObjects::SnapObjectType)14>;
  local_248 = NSSnapObjects::DoObjectInflation_SnapBoxedValue;
  local_240 = NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue;
  local_238 = NSSnapObjects::EmitAddtlInfo_SnapBoxedValue;
  local_230 = NSSnapObjects::ParseAddtlInfo_SnapBoxedValue;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0xf].InflationFunc = NSSnapObjects::DoObjectInflation_SnapBoxedValue;
  pSVar1[0xf].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue;
  pSVar1[0xf].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapBoxedValue;
  pSVar1[0xf].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapBoxedValue;
  local_268 = NSSnapObjects::DoObjectInflation_SnapDate;
  local_260 = 0;
  local_258 = NSSnapObjects::EmitAddtlInfo_SnapDate;
  local_250 = NSSnapObjects::ParseAddtlInfo_SnapDate;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x10].InflationFunc = NSSnapObjects::DoObjectInflation_SnapDate;
  pSVar1[0x10].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x10].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapDate;
  pSVar1[0x10].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapDate;
  local_288 = NSSnapObjects::DoObjectInflation_SnapRegexInfo;
  local_280 = 0;
  local_278 = NSSnapObjects::EmitAddtlInfo_SnapRegexInfo;
  local_270 = NSSnapObjects::ParseAddtlInfo_SnapRegexInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x11].InflationFunc = NSSnapObjects::DoObjectInflation_SnapRegexInfo;
  pSVar1[0x11].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x11].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapRegexInfo;
  pSVar1[0x11].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapRegexInfo;
  memset(&local_2a8,0,0x20);
  local_2a8 = NSSnapObjects::DoObjectInflation_SnapError;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x12].InflationFunc = NSSnapObjects::DoObjectInflation_SnapError;
  pSVar1[0x12].AddtlInstationationFunc = local_2a0;
  pSVar1[0x12].EmitAddtlInfoFunc = local_298;
  pSVar1[0x12].ParseAddtlInfoFunc = local_290;
  local_2c8 = NSSnapObjects::
              DoObjectInflation_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  local_2c0 = NSSnapObjects::
              DoAddtlValueInstantiation_SnapArrayInfo<void*,void*,(TTD::NSSnapObjects::SnapObjectType)19>
  ;
  local_2b8 = NSSnapObjects::
              EmitAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  local_2b0 = NSSnapObjects::
              ParseAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x13].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<void*,void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  pSVar1[0x13].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<void*,(TTD::NSSnapObjects::SnapObjectType)19>;
  local_2e8 = NSSnapObjects::
              DoObjectInflation_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  local_2e0 = NSSnapObjects::
              DoAddtlValueInstantiation_SnapArrayInfo<int,int,(TTD::NSSnapObjects::SnapObjectType)20>
  ;
  local_2d8 = NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>
  ;
  local_2d0 = NSSnapObjects::
              ParseAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x14].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<int,int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  pSVar1[0x14].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int,(TTD::NSSnapObjects::SnapObjectType)20>;
  local_308 = NSSnapObjects::
              DoObjectInflation_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  local_300 = NSSnapObjects::
              DoAddtlValueInstantiation_SnapArrayInfo<double,double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  local_2f8 = NSSnapObjects::
              EmitAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  local_2f0 = NSSnapObjects::
              ParseAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x15].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar1[0x15].AddtlInstationationFunc =
       NSSnapObjects::
       DoAddtlValueInstantiation_SnapArrayInfo<double,double,(TTD::NSSnapObjects::SnapObjectType)21>
  ;
  pSVar1[0x15].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  pSVar1[0x15].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double,(TTD::NSSnapObjects::SnapObjectType)21>;
  local_328 = NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo;
  local_320 = NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo;
  local_318 = NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo;
  local_310 = NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x16].InflationFunc = NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo;
  pSVar1[0x16].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo;
  pSVar1[0x16].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo;
  pSVar1[0x16].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo;
  local_348 = NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo;
  local_340 = 0;
  local_338 = NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo;
  local_330 = NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x17].InflationFunc = NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo;
  pSVar1[0x17].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x17].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo;
  pSVar1[0x17].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo;
  local_368 = NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo;
  local_360 = 0;
  local_358 = NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo;
  local_350 = NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x18].InflationFunc = NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo;
  pSVar1[0x18].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x18].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo;
  pSVar1[0x18].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo;
  local_388 = NSSnapObjects::DoObjectInflation_SnapSetInfo;
  local_380 = NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo;
  local_378 = NSSnapObjects::EmitAddtlInfo_SnapSetInfo;
  local_370 = NSSnapObjects::ParseAddtlInfo_SnapSetInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x19].InflationFunc = NSSnapObjects::DoObjectInflation_SnapSetInfo;
  pSVar1[0x19].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo;
  pSVar1[0x19].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapSetInfo;
  pSVar1[0x19].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapSetInfo;
  local_3a8 = NSSnapObjects::DoObjectInflation_SnapMapInfo;
  local_3a0 = NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo;
  local_398 = NSSnapObjects::EmitAddtlInfo_SnapMapInfo;
  local_390 = NSSnapObjects::ParseAddtlInfo_SnapMapInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1a].InflationFunc = NSSnapObjects::DoObjectInflation_SnapMapInfo;
  pSVar1[0x1a].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo;
  pSVar1[0x1a].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapMapInfo;
  pSVar1[0x1a].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapMapInfo;
  local_3c8 = NSSnapObjects::DoObjectInflation_SnapProxyInfo;
  local_3c0 = 0;
  local_3b8 = NSSnapObjects::EmitAddtlInfo_SnapProxyInfo;
  local_3b0 = NSSnapObjects::ParseAddtlInfo_SnapProxyInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1b].InflationFunc = NSSnapObjects::DoObjectInflation_SnapProxyInfo;
  pSVar1[0x1b].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1b].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapProxyInfo;
  pSVar1[0x1b].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapProxyInfo;
  local_3e8 = NSSnapObjects::DoObjectInflation_SnapPromiseInfo;
  local_3e0 = 0;
  local_3d8 = NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo;
  local_3d0 = NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1c].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseInfo;
  pSVar1[0x1c].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1c].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo;
  pSVar1[0x1c].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo;
  local_408 = NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo;
  local_400 = 0;
  local_3f8 = NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  local_3f0 = NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1d].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1[0x1d].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1d].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  pSVar1[0x1d].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo;
  local_428 = NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo;
  local_420 = 0;
  local_418 = NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  local_410 = NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1e].InflationFunc = NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo;
  pSVar1[0x1e].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1e].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  pSVar1[0x1e].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo;
  local_448 = NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo;
  local_440 = 0;
  local_438 = NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  local_430 = NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x1f].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1[0x1f].AddtlInstationationFunc = (fPtr_DoAddtlValueInstantiation)0x0;
  pSVar1[0x1f].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  pSVar1[0x1f].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo;
  local_468 = NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo;
  local_460 = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo;
  local_458 = NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo;
  local_450 = NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x22].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo;
  pSVar1[0x22].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo;
  pSVar1[0x22].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo;
  pSVar1[0x22].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo;
  local_488 = NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo;
  local_480 = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo;
  local_478 = NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  local_470 = NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x23].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  pSVar1[0x23].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo;
  local_4a8 = NSSnapObjects::DoObjectInflation_SnapAsyncFunction;
  local_4a0 = NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction;
  local_498 = NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction;
  local_490 = NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x24].InflationFunc = NSSnapObjects::DoObjectInflation_SnapAsyncFunction;
  pSVar1[0x24].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction;
  pSVar1[0x24].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction;
  pSVar1[0x24].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction;
  local_4c8 = NSSnapObjects::DoObjectInflation_SnapGeneratorInfo;
  local_4c0 = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo;
  local_4b8 = NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo;
  local_4b0 = NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x25].InflationFunc = NSSnapObjects::DoObjectInflation_SnapGeneratorInfo;
  pSVar1[0x25].AddtlInstationationFunc = NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo;
  pSVar1[0x25].EmitAddtlInfoFunc = NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo;
  pSVar1[0x25].ParseAddtlInfoFunc = NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo;
  local_4e8 = NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  local_4e0 = NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  local_4d8 = NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  local_4d0 = NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x28].InflationFunc =
       NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].AddtlInstationationFunc =
       NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].EmitAddtlInfoFunc =
       NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  pSVar1[0x28].ParseAddtlInfoFunc =
       NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo;
  memset(&local_508,0,0x20);
  pSVar1 = this->m_snapObjectVTableArray;
  pSVar1[0x29].InflationFunc = local_508;
  pSVar1[0x29].AddtlInstationationFunc = local_500;
  pSVar1[0x29].EmitAddtlInfoFunc = local_4f8;
  pSVar1[0x29].ParseAddtlInfoFunc = local_4f0;
  return;
}

Assistant:

SnapShot::SnapShot(double gcTime)
        : m_slabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_LARGE),
        m_ctxList(&this->m_slabAllocator), m_tcSymbolRegistrationMapContents(&this->m_slabAllocator), m_activeScriptContext(TTD_INVALID_LOG_PTR_ID),
        m_rootList(&this->m_slabAllocator),
        m_handlerList(&this->m_slabAllocator), m_typeList(&this->m_slabAllocator),
        m_functionBodyList(&this->m_slabAllocator), m_primitiveObjectList(&this->m_slabAllocator), m_compoundObjectList(&this->m_slabAllocator),
        m_scopeEntries(&this->m_slabAllocator), m_slotArrayEntries(&this->m_slabAllocator),
        m_snapObjectVTableArray(nullptr),
        GCTime(gcTime), MarkTime(0.0), ExtractTime(0.0)
    {
        this->m_snapObjectVTableArray = this->m_slabAllocator.SlabAllocateArray<NSSnapObjects::SnapObjectVTable>((uint32)NSSnapObjects::SnapObjectType::Limit);
        memset(this->m_snapObjectVTableArray, 0, sizeof(NSSnapObjects::SnapObjectVTable) * (uint32)NSSnapObjects::SnapObjectType::Limit);

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::Invalid] = { nullptr, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapUnhandledObject] = { nullptr, nullptr, nullptr, nullptr };

        ////
        //For the objects that have inflators

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDynamicObject] = { &NSSnapObjects::DoObjectInflation_SnapDynamicObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAwaitObject] = { &NSSnapObjects::DoObjectInflation_SnapAwaitObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapScriptFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfo, &NSSnapObjects::EmitAddtlInfo_SnapScriptFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeFunctionObject] = { nullptr, nullptr, nullptr, nullptr }; //should always be wellknown objects and the extra state is in the functionbody defs
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapExternalFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapExternalFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapExternalFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapExternalFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRuntimeRevokerFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapRevokerFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRevokerFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapRevokerFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoundFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapBoundFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapBoundFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapActivationInfo, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBlockActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapBlockActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPseudoActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapPseudoActivationObject, nullptr, nullptr, nullptr };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapConsoleScopeActivationObject] = { &NSSnapObjects::DoObjectInflation_SnapConsoleScopeActivationObject, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapHeapArgumentsObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject] = { &NSSnapObjects::DoObjectInflation_SnapES5HeapArgumentsInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject>, &NSSnapObjects::ParseAddtlInfo_SnapHeapArgumentsInfo<NSSnapObjects::SnapObjectType::SnapES5HeapArgumentsObject> };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapBoxedValueObject] = { &NSSnapObjects::DoObjectInflation_SnapBoxedValue, &NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue, &NSSnapObjects::EmitAddtlInfo_SnapBoxedValue, &NSSnapObjects::ParseAddtlInfo_SnapBoxedValue };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapDateObject] = { &NSSnapObjects::DoObjectInflation_SnapDate, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapDate, &NSSnapObjects::ParseAddtlInfo_SnapDate };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapRegexObject] = { &NSSnapObjects::DoObjectInflation_SnapRegexInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapRegexInfo, &NSSnapObjects::ParseAddtlInfo_SnapRegexInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapErrorObject] = { &NSSnapObjects::DoObjectInflation_SnapError, nullptr, nullptr, nullptr };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<TTDVar, Js::Var, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<TTDVar, NSSnapObjects::SnapObjectType::SnapArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<int32, int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<int32, NSSnapObjects::SnapObjectType::SnapNativeIntArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfo<double, double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::EmitAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject>, &NSSnapObjects::ParseAddtlInfo_SnapArrayInfo<double, NSSnapObjects::SnapObjectType::SnapNativeFloatArrayObject> };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapES5ArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapES5ArrayInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapES5ArrayInfo, &NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapES5ArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapArrayBufferObject] = { &NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo, &NSSnapObjects::ParseAddtlInfo_SnapArrayBufferInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapTypedArrayObject] = { &NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapTypedArrayInfo, &NSSnapObjects::ParseAddtlInfo_SnapTypedArrayInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapSetObject] = { &NSSnapObjects::DoObjectInflation_SnapSetInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapSetInfo, &NSSnapObjects::EmitAddtlInfo_SnapSetInfo, &NSSnapObjects::ParseAddtlInfo_SnapSetInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapMapObject] = { &NSSnapObjects::DoObjectInflation_SnapMapInfo, &NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo, &NSSnapObjects::EmitAddtlInfo_SnapMapInfo, &NSSnapObjects::ParseAddtlInfo_SnapMapInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapProxyObject] = { &NSSnapObjects::DoObjectInflation_SnapProxyInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapProxyInfo, &NSSnapObjects::ParseAddtlInfo_SnapProxyInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseResolveOrRejectFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseResolveOrRejectFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseResolveOrRejectFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseReactionTaskFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseReactionTaskFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseReactionTaskFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseReactionTaskFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapPromiseAllResolveElementFunctionObject] = { &NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo, nullptr, &NSSnapObjects::EmitAddtlInfo_SnapPromiseAllResolveElementFunctionInfo, &NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo };

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGeneratorVirtualScriptFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorVirtualScriptFunctionInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapAsyncFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapAsyncFunction,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapAsyncFunction,
            &NSSnapObjects::EmitAddtlInfo_SnapAsyncFunction,
            &NSSnapObjects::ParseAddtlInfo_SnapAsyncFunction
        };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapGenerator] = {
            &NSSnapObjects::DoObjectInflation_SnapGeneratorInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapGeneratorInfo };
        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::JavascriptAsyncSpawnStepFunction] = {
            &NSSnapObjects::DoObjectInflation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::DoAddtlValueInstantiation_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::EmitAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo,
            &NSSnapObjects::ParseAddtlInfo_SnapJavascriptAsyncSpawnStepFunctionInfo
        };



        ////
        //For the objects that are always well known

        this->m_snapObjectVTableArray[(uint32)NSSnapObjects::SnapObjectType::SnapWellKnownObject] = { nullptr, nullptr, nullptr, nullptr };
    }